

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_update_state(AV1_COMP *cpi,ThreadData_conflict *td,PICK_MODE_CONTEXT *ctx,int mi_row,
                     int mi_col,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  AV1_COMMON *cm;
  uint64_t *puVar1;
  int *piVar2;
  CANDIDATE_MV *pCVar3;
  uint *puVar4;
  uint8_t uVar5;
  BLOCK_SIZE BVar6;
  _Bool _Var7;
  char cVar8;
  int iVar9;
  MB_MODE_INFO *__dest;
  MB_MODE_INFO *pMVar10;
  MB_MODE_INFO *pMVar11;
  FRAME_COUNTS *pFVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  CANDIDATE_MV CVar17;
  CANDIDATE_MV CVar18;
  CANDIDATE_MV CVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  bool bVar23;
  AQ_MODE AVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  EncSegmentationInfo *pEVar28;
  uint8_t **ppuVar29;
  ushort uVar30;
  undefined4 uVar31;
  MB_MODE_INFO_EXT_FRAME *pMVar32;
  uint uVar33;
  uint uVar34;
  uint8_t *puVar35;
  uint8_t *puVar36;
  byte bVar37;
  int iVar38;
  ulong uVar39;
  byte bVar40;
  int iVar41;
  long lVar42;
  byte bVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  long lVar47;
  byte bVar48;
  uint uVar49;
  uint uVar50;
  undefined7 in_register_00000089;
  int iVar51;
  int iVar52;
  int iVar53;
  ulong uVar54;
  bool bVar55;
  short sVar56;
  short sVar60;
  short sVar61;
  short sVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  int bh;
  
  uVar5 = ((cpi->common).seq_params)->monochrome;
  __dest = *(td->mb).e_mbd.mi;
  BVar6 = (ctx->mic).bsize;
  uVar33 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar6]
  ;
  uVar46 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar6]
  ;
  iVar27 = (cpi->common).mi_params.mi_stride;
  uVar39 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  uVar26 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [uVar39];
  uVar50 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar39];
  memcpy(__dest,ctx,0xb0);
  pMVar32 = &ctx->mbmi_ext_best;
  bVar40 = (ctx->mic).ref_frame[0];
  bVar48 = (ctx->mic).ref_frame[1];
  if ('\0' < (char)bVar48) {
    if (bVar48 < 5 || '\x04' < (char)bVar40) {
      lVar42 = 0;
      do {
        if ((bVar40 == (&comp_ref0_lut)[lVar42]) && (bVar48 == (&comp_ref1_lut)[lVar42])) {
          bVar40 = (char)lVar42 + 0x14;
          goto LAB_001a42e0;
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 != 9);
    }
    bVar40 = (bVar48 * '\x04' + bVar40) - 0xd;
  }
LAB_001a42e0:
  CVar17 = pMVar32->ref_mv_stack[0];
  CVar18 = (ctx->mbmi_ext_best).ref_mv_stack[1];
  CVar19 = (ctx->mbmi_ext_best).ref_mv_stack[3];
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar40] + 2;
  *pCVar3 = (ctx->mbmi_ext_best).ref_mv_stack[2];
  pCVar3[1] = CVar19;
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar40];
  *pCVar3 = CVar17;
  pCVar3[1] = CVar18;
  (td->mb).mbmi_ext.weight[bVar40] = *&(ctx->mbmi_ext_best).weight;
  (td->mb).mbmi_ext.mode_context[bVar40] = (ctx->mbmi_ext_best).mode_context;
  (td->mb).mbmi_ext.ref_mv_count[bVar40] = (ctx->mbmi_ext_best).ref_mv_count;
  uVar20 = *(undefined8 *)(ctx->mbmi_ext_best).global_mvs;
  uVar21 = *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 2);
  uVar22 = *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 6);
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 4) =
       *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 4);
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 6) = uVar22;
  *(undefined8 *)(td->mb).mbmi_ext.global_mvs = uVar20;
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 2) = uVar21;
  memcpy((td->mb).txfm_search_info.blk_skip,ctx->blk_skip,(long)ctx->num_4x4_blk);
  (td->mb).txfm_search_info.skip_txfm = (ctx->rd_stats).skip_txfm;
  (td->mb).e_mbd.tx_type_map = ctx->tx_type_map;
  (td->mb).e_mbd.tx_type_map_stride = uVar26;
  if (dry_run == '\0') {
    uVar25 = (cpi->common).mi_params.mi_stride;
    pMVar32 = (MB_MODE_INFO_EXT_FRAME *)(ulong)uVar25;
    puVar35 = (cpi->common).mi_params.tx_type_map + (int)(uVar25 * mi_row + mi_col);
    uVar39 = 0;
    puVar36 = puVar35;
    do {
      memcpy(puVar36,(td->mb).e_mbd.tx_type_map + (long)(td->mb).e_mbd.tx_type_map_stride * uVar39,
             (ulong)uVar33);
      uVar39 = uVar39 + 1;
      puVar36 = puVar36 + (int)uVar25;
    } while (uVar46 + (uVar46 == 0) != uVar39);
    (td->mb).e_mbd.tx_type_map = puVar35;
    (td->mb).e_mbd.tx_type_map_stride = uVar25;
  }
  cm = &cpi->common;
  if ((cpi->common).seg.enabled == '\0') {
LAB_001a4a39:
    if (dry_run != '\0') goto LAB_001a4adc;
  }
  else {
    AVar24 = (cpi->oxcf).q_cfg.aq_mode;
    if (AVar24 == '\x02') {
      pEVar28 = &cpi->enc_seg;
      if ((cpi->common).seg.update_map == '\0') {
        pEVar28 = (EncSegmentationInfo *)&(cpi->common).last_frame_seg_map;
      }
      if (pEVar28->map == (uint8_t *)0x0) {
        uVar25 = 0;
      }
      else {
        uVar34 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)uVar50 <= (int)uVar34) {
          uVar34 = uVar50;
        }
        uVar25 = 0;
        if (0 < (int)uVar34) {
          iVar41 = (cpi->common).mi_params.mi_cols;
          uVar49 = iVar41 - mi_col;
          if ((int)uVar26 <= iVar41 - mi_col) {
            uVar49 = uVar26;
          }
          iVar44 = iVar41 * mi_row + mi_col;
          bVar40 = 8;
          do {
            uVar39 = (ulong)uVar49;
            iVar51 = iVar44;
            bVar48 = bVar40;
            if (0 < (int)uVar49) {
              do {
                bVar40 = pEVar28->map[iVar51];
                if (bVar48 < bVar40) {
                  bVar40 = bVar48;
                }
                iVar51 = iVar51 + 1;
                uVar39 = uVar39 - 1;
                bVar48 = bVar40;
              } while (uVar39 != 0);
            }
            uVar25 = uVar25 + 1;
            iVar44 = iVar44 + iVar41;
          } while (uVar25 != uVar34);
          uVar25 = (uint)(bVar40 & 7);
        }
      }
      uVar34 = *(ushort *)&__dest->field_0xa7 & 0xfffffff8;
      pMVar32 = (MB_MODE_INFO_EXT_FRAME *)(ulong)uVar34;
      *(ushort *)&__dest->field_0xa7 = (ushort)uVar25 | (ushort)uVar34;
      AVar24 = (cpi->oxcf).q_cfg.aq_mode;
    }
    if (((AVar24 == '\x03') && ((~*(ushort *)&__dest->field_0xa7 & 7) != 0)) &&
       ((cpi->rc).rtc_external_ratectrl == 0)) {
      pMVar32 = (MB_MODE_INFO_EXT_FRAME *)(ulong)(uint)mi_col;
      av1_cyclic_refresh_update_segment
                (cpi,&td->mb,mi_row,mi_col,bsize,(long)(ctx->rd_stats).rate,(ctx->rd_stats).dist,
                 (uint)(td->mb).txfm_search_info.skip_txfm,dry_run);
    }
    if (__dest->uv_mode == '\r') {
      pMVar10 = *(td->mb).e_mbd.mi;
      uVar39 = (ulong)pMVar10->bsize;
      if ((td->mb).e_mbd.lossless[*(ushort *)&pMVar10->field_0xa7 & 7] == 0) {
        pMVar32 = (MB_MODE_INFO_EXT_FRAME *)
                  CONCAT71(0x2f0b,(0x2f0bffUL >> (uVar39 & 0x3f) & 1) != 0);
        if ((0x1f07ffUL >> (uVar39 & 0x3f) & 1) != 0) goto LAB_001a4606;
      }
      else {
        iVar41 = (td->mb).e_mbd.plane[1].subsampling_x;
        pMVar32 = (MB_MODE_INFO_EXT_FRAME *)
                  CONCAT71((int7)(int3)((uint)iVar41 >> 8),
                           av1_ss_size_lookup[uVar39][iVar41][(td->mb).e_mbd.plane[1].subsampling_y]
                           == BLOCK_4X4);
LAB_001a4606:
        if ((char)pMVar32 != '\0') goto LAB_001a4610;
      }
      __dest->uv_mode = '\0';
    }
LAB_001a4610:
    if (dry_run != '\0') goto LAB_001a4adc;
    if (__dest->skip_txfm == '\0') {
      iVar51 = 2 - (uint)(cpi->cyclic_refresh->skip_over4x4 == 0);
      iVar41 = (td->mb).e_mbd.mi_row;
      iVar44 = (td->mb).e_mbd.mi_col;
      puVar36 = ((cpi->common).cur_frame)->seg_map;
      _Var7 = (td->mb).e_mbd.left_available;
      if ((td->mb).e_mbd.up_available == false) {
        bVar40 = 0xff;
        bVar48 = 0xff;
        bVar37 = bVar40;
        if ((_Var7 & 1U) != 0) goto LAB_001a47ef;
LAB_001a489a:
        uVar25 = 0;
        bVar40 = 0xff;
        bVar43 = bVar48;
      }
      else {
        iVar52 = iVar41 - iVar51;
        if ((_Var7 & 1U) == 0) {
          bVar48 = 8;
          bVar40 = 0xff;
          bVar37 = bVar40;
          if ((cpi->common).mi_params.mi_rows <= iVar52) goto LAB_001a489a;
          iVar9 = (cpi->common).mi_params.mi_cols;
        }
        else {
          if ((cpi->common).mi_params.mi_rows - iVar52 < 1) {
            bVar40 = 8;
            bVar48 = 8;
            goto LAB_001a47ef;
          }
          iVar9 = (cpi->common).mi_params.mi_cols;
          uVar34 = iVar9 - (iVar44 - iVar51);
          uVar25 = 1;
          if ((int)uVar34 < 1) {
            uVar25 = uVar34;
          }
          iVar45 = (iVar9 * iVar52 + iVar44) - iVar51;
          bVar48 = 8;
          bVar40 = 8;
          iVar38 = 0;
          do {
            uVar39 = (ulong)uVar25;
            iVar53 = iVar45;
            if (0 < (int)uVar34) {
              do {
                bVar40 = puVar36[iVar53];
                if (bVar48 < puVar36[iVar53]) {
                  bVar40 = bVar48;
                }
                iVar53 = iVar53 + 1;
                uVar39 = uVar39 - 1;
                bVar48 = bVar40;
              } while (uVar39 != 0);
            }
            iVar38 = iVar38 + 1;
            iVar45 = iVar45 + iVar9;
          } while (iVar38 != 1);
        }
        uVar25 = iVar9 - iVar44;
        uVar39 = 1;
        if ((int)uVar25 < 1) {
          uVar39 = (ulong)uVar25;
        }
        iVar38 = iVar52 * iVar9 + iVar44;
        bVar48 = 8;
        iVar52 = 0;
        do {
          uVar54 = uVar39;
          iVar45 = iVar38;
          bVar37 = bVar48;
          if (0 < (int)uVar25) {
            do {
              bVar48 = puVar36[iVar45];
              if (bVar37 < puVar36[iVar45]) {
                bVar48 = bVar37;
              }
              iVar45 = iVar45 + 1;
              uVar54 = uVar54 - 1;
              bVar37 = bVar48;
            } while (uVar54 != 0);
          }
          iVar52 = iVar52 + 1;
          iVar38 = iVar38 + iVar9;
        } while (iVar52 != 1);
        bVar37 = 0xff;
        if ((_Var7 & 1U) != 0) {
LAB_001a47ef:
          if ((cpi->common).mi_params.mi_rows - iVar41 < 1) {
            bVar37 = 8;
          }
          else {
            iVar52 = (cpi->common).mi_params.mi_cols;
            uVar34 = iVar52 - (iVar44 - iVar51);
            uVar25 = 1;
            if ((int)uVar34 < 1) {
              uVar25 = uVar34;
            }
            iVar51 = (iVar41 * iVar52 + iVar44) - iVar51;
            bVar37 = 8;
            iVar41 = 0;
            do {
              uVar39 = (ulong)uVar25;
              iVar44 = iVar51;
              bVar43 = bVar37;
              if (0 < (int)uVar34) {
                do {
                  bVar37 = puVar36[iVar44];
                  if (bVar43 < puVar36[iVar44]) {
                    bVar37 = bVar43;
                  }
                  iVar44 = iVar44 + 1;
                  uVar39 = uVar39 - 1;
                  bVar43 = bVar37;
                } while (uVar39 != 0);
              }
              iVar41 = iVar41 + 1;
              iVar51 = iVar51 + iVar52;
            } while (iVar41 != 1);
          }
        }
        if (bVar40 == 0xff) goto LAB_001a489a;
        if ((bVar40 != bVar48) || (uVar25 = 2, bVar43 = bVar40, bVar40 != bVar37)) {
          uVar25 = (uint)((bVar37 == bVar48 || bVar40 == bVar37) || bVar40 == bVar48);
          bVar43 = bVar48;
        }
      }
      if (bVar48 == 0xff) {
        bVar48 = 0;
        if (bVar37 != 0xff) {
          bVar48 = bVar37;
        }
      }
      else if ((bVar37 != 0xff) && (bVar48 = bVar37, bVar40 == bVar43)) {
        bVar48 = bVar43;
      }
      uVar34 = av1_neg_interleave(*(ushort *)&__dest->field_0xa7 & 7,(uint)bVar48,
                                  (cpi->common).seg.last_active_segid + 1);
      lVar42 = (long)*(int *)((long)(td->mb).mode_costs.spatial_pred_cost[0] +
                             (ulong)(uVar34 & 0xff) * 4 + (ulong)(uVar25 << 5));
      puVar1 = (td->rd_counts).seg_tmp_pred_cost;
      *puVar1 = *puVar1 + lVar42;
      puVar36 = (cpi->common).last_frame_seg_map;
      if (puVar36 == (uint8_t *)0x0) {
        uVar30 = 0;
      }
      else {
        uVar25 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)uVar50 <= (int)uVar25) {
          uVar25 = uVar50;
        }
        if ((int)uVar25 < 1) {
          uVar30 = 8;
        }
        else {
          iVar41 = (cpi->common).mi_params.mi_cols;
          uVar34 = iVar41 - mi_col;
          if ((int)uVar26 <= iVar41 - mi_col) {
            uVar34 = uVar26;
          }
          iVar44 = iVar41 * mi_row + mi_col;
          bVar48 = 8;
          bVar40 = 8;
          uVar49 = 0;
          do {
            uVar39 = (ulong)uVar34;
            iVar51 = iVar44;
            if (0 < (int)uVar34) {
              do {
                bVar40 = puVar36[iVar51];
                if (bVar48 < bVar40) {
                  bVar40 = bVar48;
                }
                iVar51 = iVar51 + 1;
                uVar39 = uVar39 - 1;
                bVar48 = bVar40;
              } while (uVar39 != 0);
            }
            uVar49 = uVar49 + 1;
            iVar44 = iVar44 + iVar41;
          } while (uVar49 != uVar25);
          uVar30 = (ushort)bVar40;
        }
      }
      pMVar10 = (td->mb).e_mbd.left_mbmi;
      pMVar11 = (td->mb).e_mbd.above_mbmi;
      if (pMVar11 == (MB_MODE_INFO *)0x0) {
        uVar25 = 0;
      }
      else {
        uVar25 = *(ushort *)&pMVar11->field_0xa7 >> 3 & 1;
      }
      if (pMVar10 == (MB_MODE_INFO *)0x0) {
        uVar34 = 0;
      }
      else {
        uVar34 = *(ushort *)&pMVar10->field_0xa7 >> 3 & 1;
      }
      bVar55 = uVar30 == (*(ushort *)&__dest->field_0xa7 & 7);
      pMVar32 = (MB_MODE_INFO_EXT_FRAME *)
                (long)(td->mb).mode_costs.tmp_pred_cost[uVar34 + uVar25][bVar55];
      if (bVar55) {
        lVar42 = 0;
      }
      puVar1 = (td->rd_counts).seg_tmp_pred_cost + 1;
      *puVar1 = (long)&pMVar32->ref_mv_stack[0].this_mv + *puVar1 + lVar42;
      goto LAB_001a4a39;
    }
  }
  if (((cm->current_frame).frame_type & 0xfd) != 0) {
    bVar55 = ((ctx->mic).field_0xa7 & 0x80) == 0;
    cVar8 = (ctx->mic).ref_frame[0];
    if (!bVar55 || '\0' < cVar8) {
      uVar39 = *(ulong *)(ctx->mic).mv;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar39;
      sVar56 = (short)uVar39;
      sVar13 = -sVar56;
      sVar60 = (short)(uVar39 >> 0x10);
      sVar14 = -sVar60;
      sVar61 = (short)(uVar39 >> 0x20);
      sVar15 = -sVar61;
      sVar62 = (short)(uVar39 >> 0x30);
      sVar16 = -sVar62;
      auVar63._0_2_ = (ushort)(sVar13 < sVar56) * sVar56 | (ushort)(sVar13 >= sVar56) * sVar13;
      auVar63._2_2_ = (ushort)(sVar14 < sVar60) * sVar60 | (ushort)(sVar14 >= sVar60) * sVar14;
      auVar63._4_2_ = (ushort)(sVar15 < sVar61) * sVar61 | (ushort)(sVar15 >= sVar61) * sVar15;
      auVar63._6_2_ = (ushort)(sVar16 < sVar62) * sVar62 | (ushort)(sVar16 >= sVar62) * sVar16;
      auVar63._8_8_ = 0;
      auVar57 = pshuflw(auVar57,auVar63,0x50);
      auVar58._0_4_ = auVar57._0_4_;
      auVar58._4_4_ = auVar58._0_4_;
      auVar58._8_4_ = auVar57._4_4_;
      auVar58._12_4_ = auVar57._4_4_;
      auVar58 = auVar58 ^ _DAT_004d8ba0;
      auVar59._0_2_ = -(ushort)(-0x7ff9 < auVar58._0_2_);
      auVar59._2_2_ = -(ushort)(-0x7ff9 < auVar58._2_2_);
      auVar59._4_2_ = -(ushort)(-0x7ff9 < auVar58._4_2_);
      auVar59._6_2_ = -(ushort)(-0x7ff9 < auVar58._6_2_);
      auVar59._8_2_ = -(ushort)(-0x7ff9 < auVar58._8_2_);
      auVar59._10_2_ = -(ushort)(-0x7ff9 < auVar58._10_2_);
      auVar59._12_2_ = -(ushort)(-0x7ff9 < auVar58._12_2_);
      auVar59._14_2_ = -(ushort)(-0x7ff9 < auVar58._14_2_);
      uVar31 = movmskpd((int)CONCAT71((int7)((ulong)pMVar32 >> 8),bVar55),auVar59);
      if ((byte)((((byte)uVar31 ^ 3) & 2) >> 1 & cVar8 == '\x01' & ((byte)uVar31 ^ 3)) == 1) {
        uVar25 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)uVar46 <= (int)uVar25) {
          uVar25 = uVar46;
        }
        if (0 < (int)uVar25) {
          piVar2 = &(td->mb).cnt_zeromv;
          *piVar2 = *piVar2 + ((uVar25 - 1 & 0xfffffffe) + 2) * uVar33;
        }
      }
    }
  }
LAB_001a4adc:
  ppuVar29 = &(td->mb).plane[0].txb_entropy_ctx;
  uVar39 = 0;
  do {
    ppuVar29[-2] = (uint8_t *)ctx->coeff[uVar39];
    ppuVar29[-3] = (uint8_t *)ctx->qcoeff[uVar39];
    ppuVar29[-4] = (uint8_t *)ctx->dqcoeff[uVar39];
    ppuVar29[-1] = (uint8_t *)ctx->eobs[uVar39];
    *ppuVar29 = ctx->txb_entropy_ctx[uVar39];
    if (uVar5 != '\0') break;
    ppuVar29 = ppuVar29 + 0x11;
    bVar55 = uVar39 < 2;
    uVar39 = uVar39 + 1;
  } while (bVar55);
  (td->mb).e_mbd.plane[0].color_index_map = ctx->color_index_map[0];
  (td->mb).e_mbd.plane[1].color_index_map = ctx->color_index_map[1];
  iVar41 = (td->mb).e_mbd.mb_to_bottom_edge;
  uVar25 = iVar41 >> 0x1f & iVar41 >> 5;
  uVar34 = uVar25 + uVar50;
  if (uVar34 != 0 && SCARRY4(uVar25,uVar50) == (int)uVar34 < 0) {
    iVar41 = (td->mb).e_mbd.mb_to_right_edge;
    uVar26 = (iVar41 >> 0x1f & iVar41 >> 5) + uVar26;
    lVar42 = 0;
    uVar39 = 0;
    do {
      uVar54 = (ulong)uVar26;
      lVar47 = lVar42;
      if (0 < (int)uVar26) {
        do {
          *(MB_MODE_INFO **)((long)(td->mb).e_mbd.mi + lVar47) = __dest;
          uVar54 = uVar54 - 1;
          lVar47 = lVar47 + 8;
        } while (uVar54 != 0);
      }
      uVar39 = uVar39 + 1;
      lVar42 = lVar42 + (long)iVar27 * 8;
    } while (uVar39 != uVar34);
  }
  if ((cpi->oxcf).q_cfg.aq_mode != '\0') {
    av1_init_plane_quantizers(cpi,&td->mb,*(ushort *)&__dest->field_0xa7 & 7,0);
  }
  if (dry_run == '\0') {
    if ((((cm->current_frame).frame_type & 0xfd) != 0) &&
       (((((ctx->mic).field_0xa7 & 0x80) != 0 || ('\0' < (ctx->mic).ref_frame[0])) &&
        ((cpi->common).features.interp_filter == MULTITAP_SHARP2)))) {
      pFVar12 = td->counts;
      iVar27 = 0;
      bVar55 = true;
      do {
        bVar23 = bVar55;
        iVar27 = av1_get_pred_context_switchable_interp(&(td->mb).e_mbd,iVar27);
        uVar50 = (__dest->interp_filters).as_int >> 0x10;
        if (bVar23) {
          uVar50 = (__dest->interp_filters).as_int;
        }
        puVar4 = pFVar12->switchable_interp[iVar27] + ((ulong)uVar50 & 0xff);
        *puVar4 = *puVar4 + 1;
        iVar27 = 1;
        bVar55 = false;
      } while (bVar23);
    }
    if ((((cpi->common).seq_params)->order_hint_info).enable_ref_frame_mvs != 0) {
      uVar50 = (cpi->common).mi_params.mi_rows - mi_row;
      if ((int)uVar46 <= (int)uVar50) {
        uVar50 = uVar46;
      }
      uVar46 = (cpi->common).mi_params.mi_cols - mi_col;
      if ((int)uVar33 <= (int)uVar46) {
        uVar46 = uVar33;
      }
      av1_copy_frame_mvs(cm,&ctx->mic,mi_row,mi_col,uVar46,uVar50);
      return;
    }
  }
  return;
}

Assistant:

void av1_update_state(const AV1_COMP *const cpi, ThreadData *td,
                      const PICK_MODE_CONTEXT *const ctx, int mi_row,
                      int mi_col, BLOCK_SIZE bsize, RUN_TYPE dry_run) {
  int i, x_idx, y;
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const MB_MODE_INFO *const mi = &ctx->mic;
  MB_MODE_INFO *const mi_addr = xd->mi[0];
  const struct segmentation *const seg = &cm->seg;
  assert(bsize < BLOCK_SIZES_ALL);
  const int bw = mi_size_wide[mi->bsize];
  const int bh = mi_size_high[mi->bsize];
  const int mis = mi_params->mi_stride;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  assert(mi->bsize == bsize);

  *mi_addr = *mi;
  copy_mbmi_ext_frame_to_mbmi_ext(&x->mbmi_ext, &ctx->mbmi_ext_best,
                                  av1_ref_frame_type(ctx->mic.ref_frame));

  memcpy(txfm_info->blk_skip, ctx->blk_skip,
         sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);

  txfm_info->skip_txfm = ctx->rd_stats.skip_txfm;

  xd->tx_type_map = ctx->tx_type_map;
  xd->tx_type_map_stride = mi_size_wide[bsize];
  // If not dry_run, copy the transform type data into the frame level buffer.
  // Encoder will fetch tx types when writing bitstream.
  if (!dry_run) {
    const int grid_idx = get_mi_grid_idx(mi_params, mi_row, mi_col);
    uint8_t *const tx_type_map = mi_params->tx_type_map + grid_idx;
    const int mi_stride = mi_params->mi_stride;
    for (int blk_row = 0; blk_row < bh; ++blk_row) {
      av1_copy_array(tx_type_map + blk_row * mi_stride,
                     xd->tx_type_map + blk_row * xd->tx_type_map_stride, bw);
    }
    xd->tx_type_map = tx_type_map;
    xd->tx_type_map_stride = mi_stride;
  }

  // If segmentation in use
  if (seg->enabled) {
    // For in frame complexity AQ copy the segment id from the segment map.
    if (cpi->oxcf.q_cfg.aq_mode == COMPLEXITY_AQ) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      mi_addr->segment_id =
          map ? get_segment_id(mi_params, map, bsize, mi_row, mi_col) : 0;
    }
    // Else for cyclic refresh mode update the segment map, set the segment id
    // and then update the quantizer.
    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
        mi_addr->segment_id != AM_SEGMENT_ID_INACTIVE &&
        !cpi->rc.rtc_external_ratectrl) {
      av1_cyclic_refresh_update_segment(cpi, x, mi_row, mi_col, bsize,
                                        ctx->rd_stats.rate, ctx->rd_stats.dist,
                                        txfm_info->skip_txfm, dry_run);
    }
    if (mi_addr->uv_mode == UV_CFL_PRED && !is_cfl_allowed(xd))
      mi_addr->uv_mode = UV_DC_PRED;

    if (!dry_run && !mi_addr->skip_txfm) {
      int cdf_num;
      const uint8_t spatial_pred = av1_get_spatial_seg_pred(
          cm, xd, &cdf_num, cpi->cyclic_refresh->skip_over4x4);
      const uint8_t coded_id = av1_neg_interleave(
          mi_addr->segment_id, spatial_pred, seg->last_active_segid + 1);
      int64_t spatial_cost = x->mode_costs.spatial_pred_cost[cdf_num][coded_id];
      td->rd_counts.seg_tmp_pred_cost[0] += spatial_cost;

      const int pred_segment_id =
          cm->last_frame_seg_map
              ? get_segment_id(mi_params, cm->last_frame_seg_map, bsize, mi_row,
                               mi_col)
              : 0;
      const int use_tmp_pred = pred_segment_id == mi_addr->segment_id;
      const uint8_t tmp_pred_ctx = av1_get_pred_context_seg_id(xd);
      td->rd_counts.seg_tmp_pred_cost[1] +=
          x->mode_costs.tmp_pred_cost[tmp_pred_ctx][use_tmp_pred];
      if (!use_tmp_pred) {
        td->rd_counts.seg_tmp_pred_cost[1] += spatial_cost;
      }
    }
  }

  // Count zero motion vector.
  if (!dry_run && !frame_is_intra_only(cm)) {
    const MV mv = mi->mv[0].as_mv;
    if (is_inter_block(mi) && mi->ref_frame[0] == LAST_FRAME &&
        abs(mv.row) < 8 && abs(mv.col) < 8) {
      const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);
      // Accumulate low_content_frame.
      for (int mi_y = 0; mi_y < ymis; mi_y += 2) x->cnt_zeromv += bw << 1;
    }
  }

  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }
  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];
  // Restore the coding context of the MB to that that was in place
  // when the mode was picked for it

  const int cols =
      AOMMIN((xd->mb_to_right_edge >> (3 + MI_SIZE_LOG2)) + mi_width, mi_width);
  const int rows = AOMMIN(
      (xd->mb_to_bottom_edge >> (3 + MI_SIZE_LOG2)) + mi_height, mi_height);
  for (y = 0; y < rows; y++) {
    for (x_idx = 0; x_idx < cols; x_idx++) xd->mi[x_idx + y * mis] = mi_addr;
  }

  if (cpi->oxcf.q_cfg.aq_mode)
    av1_init_plane_quantizers(cpi, x, mi_addr->segment_id, 0);

  if (dry_run) return;

#if CONFIG_INTERNAL_STATS
  {
    unsigned int *const mode_chosen_counts =
        (unsigned int *)cpi->mode_chosen_counts;  // Cast const away.
    if (frame_is_intra_only(cm)) {
      static const int kf_mode_index[] = {
        THR_DC /*DC_PRED*/,
        THR_V_PRED /*V_PRED*/,
        THR_H_PRED /*H_PRED*/,
        THR_D45_PRED /*D45_PRED*/,
        THR_D135_PRED /*D135_PRED*/,
        THR_D113_PRED /*D113_PRED*/,
        THR_D157_PRED /*D157_PRED*/,
        THR_D203_PRED /*D203_PRED*/,
        THR_D67_PRED /*D67_PRED*/,
        THR_SMOOTH,   /*SMOOTH_PRED*/
        THR_SMOOTH_V, /*SMOOTH_V_PRED*/
        THR_SMOOTH_H, /*SMOOTH_H_PRED*/
        THR_PAETH /*PAETH_PRED*/,
      };
      ++mode_chosen_counts[kf_mode_index[mi_addr->mode]];
    } else {
      // Note how often each mode chosen as best
      ++mode_chosen_counts[ctx->best_mode_index];
    }
  }
#endif
  if (!frame_is_intra_only(cm)) {
    if (is_inter_block(mi) && cm->features.interp_filter == SWITCHABLE) {
      // When the frame interp filter is SWITCHABLE, several cases that always
      // use the default type (EIGHTTAP_REGULAR) are described in
      // av1_is_interp_needed(). Here, we should keep the counts for all
      // applicable blocks, so the frame filter resetting decision in
      // fix_interp_filter() is made correctly.
      update_filter_type_count(td->counts, xd, mi_addr);
    }
  }

  const int x_mis = AOMMIN(bw, mi_params->mi_cols - mi_col);
  const int y_mis = AOMMIN(bh, mi_params->mi_rows - mi_row);
  if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
    av1_copy_frame_mvs(cm, mi, mi_row, mi_col, x_mis, y_mis);
}